

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O2

void __thiscall
midi_container::trim_range_of_tracks(midi_container *this,unsigned_long start,unsigned_long end)

{
  pointer pmVar1;
  pointer puVar2;
  char *pcVar3;
  unsigned_long i;
  unsigned_long uVar4;
  long lVar5;
  ulong base_timestamp;
  char *pcVar6;
  ulong *puVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  
  pmVar1 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
           super__Vector_impl_data._M_start;
  base_timestamp = 0xffffffffffffffff;
  uVar4 = start;
  do {
    if (end < uVar4) {
      if (base_timestamp - 1 < 0xfffffffffffffffe) {
        for (uVar4 = start; uVar4 <= end; uVar4 = uVar4 + 1) {
          puVar7 = *(ulong **)
                    &pmVar1[uVar4].m_events.
                     super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
          lVar8 = (long)*(pointer *)
                         ((long)&pmVar1[uVar4].m_events.
                                 super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl
                         + 8) - (long)puVar7 >> 6;
          while (bVar10 = lVar8 != 0, lVar8 = lVar8 + -1, bVar10) {
            uVar9 = *puVar7 - base_timestamp;
            if (*puVar7 < base_timestamp) {
              uVar9 = 0;
            }
            *puVar7 = uVar9;
            puVar7 = puVar7 + 8;
          }
        }
        if (start == end) {
          trim_tempo_map(this,end,base_timestamp);
          puVar2 = (this->m_timestamp_end).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + end;
          *puVar2 = *puVar2 - base_timestamp;
          puVar2 = (this->m_timestamp_loop_end).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar4 = puVar2[end];
          if (uVar4 != 0xffffffffffffffff) {
            puVar2[end] = uVar4 - base_timestamp;
          }
          puVar2 = (this->m_timestamp_loop_start).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar9 = puVar2[end];
          if (uVar9 != 0xffffffffffffffff) {
            if (uVar9 < base_timestamp || uVar9 - base_timestamp == 0) {
              puVar2[end] = 0;
            }
            else {
              puVar2[end] = uVar9 - base_timestamp;
            }
          }
        }
        else {
          trim_tempo_map(this,0,base_timestamp);
          puVar2 = (this->m_timestamp_end).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *puVar2 = *puVar2 - base_timestamp;
          puVar2 = (this->m_timestamp_loop_end).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar4 = *puVar2;
          if (uVar4 != 0xffffffffffffffff) {
            *puVar2 = uVar4 - base_timestamp;
          }
          puVar7 = (this->m_timestamp_loop_start).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar9 = *puVar7;
          if (uVar9 != 0xffffffffffffffff) {
            if (uVar9 < base_timestamp || uVar9 - base_timestamp == 0) {
              *puVar7 = 0;
            }
            else {
              *puVar7 = uVar9 - base_timestamp;
            }
          }
        }
      }
      return;
    }
    lVar8 = *(long *)&pmVar1[uVar4].m_events.
                      super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
    lVar5 = ((long)*(pointer *)
                    ((long)&pmVar1[uVar4].m_events.
                            super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl + 8)
             - lVar8 >> 6) + 1;
    pcVar3 = (char *)(lVar8 + 0x18);
    do {
      pcVar6 = pcVar3;
      lVar5 = lVar5 + -1;
      if (lVar5 == 0) goto LAB_00105b2b;
      pcVar3 = pcVar6 + 0x40;
    } while ((*(int *)(pcVar6 + -0x10) != 1) || (*pcVar6 == '\0'));
    if (*(ulong *)(pcVar6 + -0x18) < base_timestamp) {
      base_timestamp = *(ulong *)(pcVar6 + -0x18);
    }
LAB_00105b2b:
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void midi_container::trim_range_of_tracks(unsigned long start, unsigned long end)
{
    unsigned long timestamp_first_note = ~0UL;

    for (unsigned long i = start; i <= end; ++i)
    {
        unsigned long j, k;

        const midi_track & track = m_tracks[ i ];

        for (j = 0, k = track.get_count(); j < k; ++j)
        {
            const midi_event & event = track[ j ];

            if ( event.m_type == midi_event::note_on && event.m_data[ 0 ] )
                break;
        }

        if ( j < k )
        {
            if ( track[ j ].m_timestamp < timestamp_first_note )
                timestamp_first_note = track[ j ].m_timestamp;
        }
    }

    if ( timestamp_first_note < ~0UL && timestamp_first_note > 0 )
    {
        for (unsigned long i = start; i <= end; ++i)
        {
            midi_track & track = m_tracks[ i ];

            for (unsigned long j = 0, k = track.get_count(); j < k; ++j)
            {
                midi_event & event = track[ j ];
                if ( event.m_timestamp >= timestamp_first_note )
                    event.m_timestamp -= timestamp_first_note;
                else
                    event.m_timestamp = 0;
            }
        }

        if ( start == end )
        {
            trim_tempo_map( start, timestamp_first_note );

            m_timestamp_end[ start ] -= timestamp_first_note;

            if ( m_timestamp_loop_end[ start ] != ~0UL )
                m_timestamp_loop_end[ start ] -= timestamp_first_note;
            if ( m_timestamp_loop_start[ start ] != ~0UL )
            {
                if ( m_timestamp_loop_start[ start ] > timestamp_first_note )
                    m_timestamp_loop_start[ start ] -= timestamp_first_note;
                else
                    m_timestamp_loop_start[ start ] = 0;
            }
        }
        else
        {
            trim_tempo_map( 0, timestamp_first_note );

            m_timestamp_end[ 0 ] -= timestamp_first_note;

            if ( m_timestamp_loop_end[ 0 ] != ~0UL )
                m_timestamp_loop_end[ 0 ] -= timestamp_first_note;
            if ( m_timestamp_loop_start[ 0 ] != ~0UL )
            {
                if ( m_timestamp_loop_start[ 0 ] > timestamp_first_note )
                    m_timestamp_loop_start[ 0 ] -= timestamp_first_note;
                else
                    m_timestamp_loop_start[ 0 ] = 0;
            }
        }
    }
}